

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment-map.c
# Opt level: O3

_Bool mi_is_in_heap_region(void *p)

{
  _Bool _Var1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  _Var1 = _mi_arena_contains(p);
  bVar2 = true;
  if (!_Var1) {
    if (p == (void *)0x0) {
      bVar2 = false;
    }
    else {
      bVar2 = false;
      uVar4 = (long)p - 1U & 0xfffffffffe000000;
      uVar3 = 0;
      if (0 < (long)uVar4) {
        uVar3 = uVar4;
      }
      if ((uint)(uVar3 >> 0x2c) < 3) {
        bVar2 = false;
        if (mi_segment_map[uVar3 / 0x1f800000000] != (mi_segmap_part_t *)0x0) {
          bVar2 = uVar3 != 0 &&
                  (mi_segment_map[uVar3 / 0x1f800000000]->map[uVar3 % 0x1f800000000 >> 0x1f] >>
                   (uVar3 % 0x1f800000000 >> 0x19 & 0x3f) & 1) != 0;
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool mi_is_in_heap_region(const void* p) mi_attr_noexcept {
  return mi_is_valid_pointer(p);
}